

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cpp
# Opt level: O0

void ncnn::resize_bilinear_image(Mat *src,Mat *dst,float *alpha,int *xofs,float *beta,int *yofs)

{
  float fVar1;
  float fVar2;
  int iVar3;
  float *pfVar4;
  float *pfVar5;
  long in_RCX;
  float *in_RDX;
  Mat *in_RSI;
  Mat *in_RDI;
  float *in_R8;
  long in_R9;
  int dx_2;
  float *Dp;
  float *rows1p;
  float *rows0p;
  float b1;
  float b0;
  float a1_1;
  float a0_1;
  float *S1p_1;
  float *S0p;
  int sx_1;
  int dx_1;
  float *rows1p_2;
  float *rows0p_1;
  float *alphap_1;
  float *S1_1;
  float *S0;
  float a1;
  float a0;
  float *S1p;
  int sx;
  int dx;
  float *rows1p_1;
  float *alphap;
  float *S1;
  float *rows0_old;
  int sy;
  int dy;
  int prev_sy1;
  float *rows1;
  float *rows0;
  Mat rowsbuf1;
  Mat rowsbuf0;
  int h;
  int w;
  Allocator *in_stack_fffffffffffffe28;
  size_t in_stack_fffffffffffffe30;
  undefined8 in_stack_fffffffffffffe38;
  int iVar6;
  Mat *in_stack_fffffffffffffe40;
  int local_18c;
  float *local_188;
  float *local_180;
  float *local_178;
  int local_14c;
  float *local_138;
  int local_10c;
  float *local_100;
  int local_e0;
  int local_dc;
  float *local_d8;
  float *local_d0;
  Mat local_b8;
  Mat local_78;
  int local_38;
  int local_34;
  long local_30;
  float *local_28;
  long local_20;
  float *local_18;
  Mat *local_10;
  Mat *local_8;
  
  iVar6 = (int)((ulong)in_stack_fffffffffffffe38 >> 0x20);
  local_34 = in_RSI->w;
  local_38 = in_RSI->h;
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  Mat::Mat(in_stack_fffffffffffffe40,iVar6,in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  Mat::Mat(in_stack_fffffffffffffe40,iVar6,in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  local_d0 = Mat::operator_cast_to_float_(&local_78);
  local_d8 = Mat::operator_cast_to_float_(&local_b8);
  local_dc = -2;
  for (local_e0 = 0; pfVar5 = local_d0, local_e0 < local_38; local_e0 = local_e0 + 1) {
    iVar6 = *(int *)(local_30 + (long)local_e0 * 4);
    if (iVar6 != local_dc) {
      if (iVar6 == local_dc + 1) {
        local_d0 = local_d8;
        local_d8 = pfVar5;
        pfVar4 = Mat::row(local_8,iVar6 + 1);
        local_100 = local_18;
        for (local_10c = 0; local_10c < local_34; local_10c = local_10c + 1) {
          pfVar5[local_10c] =
               pfVar4[*(int *)(local_20 + (long)local_10c * 4)] * *local_100 +
               (pfVar4 + *(int *)(local_20 + (long)local_10c * 4))[1] * local_100[1];
          local_100 = local_100 + 2;
        }
      }
      else {
        pfVar5 = Mat::row(local_8,iVar6);
        pfVar4 = Mat::row(local_8,iVar6 + 1);
        local_138 = local_18;
        for (local_14c = 0; local_14c < local_34; local_14c = local_14c + 1) {
          iVar3 = *(int *)(local_20 + (long)local_14c * 4);
          fVar1 = *local_138;
          fVar2 = local_138[1];
          local_d0[local_14c] = pfVar5[iVar3] * fVar1 + (pfVar5 + iVar3)[1] * fVar2;
          local_d8[local_14c] = pfVar4[iVar3] * fVar1 + (pfVar4 + iVar3)[1] * fVar2;
          local_138 = local_138 + 2;
        }
      }
    }
    fVar1 = *local_28;
    fVar2 = local_28[1];
    local_178 = local_d0;
    local_180 = local_d8;
    local_188 = Mat::row(local_10,local_e0);
    for (local_18c = 0; local_18c < local_34; local_18c = local_18c + 1) {
      *local_188 = *local_178 * fVar1 + *local_180 * fVar2;
      local_188 = local_188 + 1;
      local_180 = local_180 + 1;
      local_178 = local_178 + 1;
    }
    local_28 = local_28 + 2;
    local_dc = iVar6;
  }
  Mat::~Mat((Mat *)0x1a68be);
  Mat::~Mat((Mat *)0x1a68cb);
  return;
}

Assistant:

static void resize_bilinear_image(const Mat& src, Mat& dst, float* alpha, int* xofs, float* beta, int* yofs)
{
    int w = dst.w;
    int h = dst.h;

    // loop body
    Mat rowsbuf0(w);
    Mat rowsbuf1(w);
    float* rows0 = rowsbuf0;
    float* rows1 = rowsbuf1;

    int prev_sy1 = -2;

    for (int dy = 0; dy < h; dy++ )
    {
        int sy = yofs[dy];

        if (sy == prev_sy1)
        {
            // reuse all rows
        }
        else if (sy == prev_sy1 + 1)
        {
            // hresize one row
            float* rows0_old = rows0;
            rows0 = rows1;
            rows1 = rows0_old;
            const float* S1 = src.row(sy+1);

            const float* alphap = alpha;
            float* rows1p = rows1;
            for (int dx = 0; dx < w; dx++)
            {
                int sx = xofs[dx];
                const float* S1p = S1 + sx;

                float a0 = alphap[0];
                float a1 = alphap[1];
                rows1p[dx] = S1p[0]*a0 + S1p[1]*a1;

                alphap += 2;
            }
        }
        else
        {
            // hresize two rows
            const float* S0 = src.row(sy);
            const float* S1 = src.row(sy+1);

            const float* alphap = alpha;
            float* rows0p = rows0;
            float* rows1p = rows1;
            for (int dx = 0; dx < w; dx++)
            {
                int sx = xofs[dx];
                const float* S0p = S0 + sx;
                const float* S1p = S1 + sx;

                float a0 = alphap[0];
                float a1 = alphap[1];
                rows0p[dx] = S0p[0]*a0 + S0p[1]*a1;
                rows1p[dx] = S1p[0]*a0 + S1p[1]*a1;

                alphap += 2;
            }
        }

        prev_sy1 = sy;

        // vresize
        float b0 = beta[0];
        float b1 = beta[1];

        float* rows0p = rows0;
        float* rows1p = rows1;
        float* Dp = dst.row(dy);
        for (int dx = 0; dx < w; dx++)
        {
//             D[x] = rows0[x]*b0 + rows1[x]*b1;
            *Dp++ = *rows0p++ * b0 + *rows1p++ * b1;
        }

        beta += 2;
    }
}